

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void __thiscall pstore::file::file_handle::~file_handle(file_handle *this)

{
  error_or<int> local_20;
  
  this->is_writable_ = false;
  close_noex(&local_20,this->file_);
  error_or<int>::~error_or(&local_20);
  this->file_ = -1;
  std::__cxx11::string::~string((string *)&this->path_);
  return;
}

Assistant:

file_handle::~file_handle () noexcept {
            is_writable_ = false;
            file_handle::close_noex (file_);
            file_ = invalid_oshandle;
        }